

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7_helpers.c
# Opt level: O0

int GmfReadBoundaryPolygons(PolMshSct *pol)

{
  int iVar1;
  long lVar2;
  int64_t *in_RDI;
  int ret;
  undefined8 in_stack_ffffffffffffffc8;
  int local_4;
  
  if (((in_RDI == (int64_t *)0x0) || (in_RDI[2] == 0)) || (in_RDI[4] == 0)) {
    local_4 = 0;
  }
  else {
    lVar2 = in_RDI[2] + (long)(int)in_RDI[1] * 8;
    iVar1 = GmfGetBlock(*in_RDI,0xcb,1,(long)(int)in_RDI[1],0,(void *)0x0,(void *)0x0,0xe,
                        CONCAT44((int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),2),in_RDI[2] + 8,
                        lVar2);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      iVar1 = GmfGetBlock(*in_RDI,0xcc,1,(long)(int)in_RDI[3],0,(void *)0x0,(void *)0x0,10,
                          in_RDI[4] + 4,in_RDI[4] + (long)(int)in_RDI[3] * 4,lVar2);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int GmfReadBoundaryPolygons(PolMshSct *pol)
{
   int ret;

   if (!pol || !pol->BndHdrTab || !pol->BndVerTab)
      return (0);

   ret = GmfGetBlock(pol->MshIdx, GmfBoundaryPolygonHeaders,
                     1, pol->NmbBndHdr, 0, NULL, NULL, GmfIntVec, 2,
                     pol->BndHdrTab[1], pol->BndHdrTab[pol->NmbBndHdr]);

   if (!ret)
      return (0);

   ret = GmfGetBlock(pol->MshIdx, GmfBoundaryPolygonVertices,
                     1, pol->NmbBndVer, 0, NULL, NULL, GmfInt,
                     &pol->BndVerTab[1], &pol->BndVerTab[pol->NmbBndVer]);

   if (!ret)
      return (0);

   return (1);
}